

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O2

secp256k1_context * secp256k1_context_preallocated_create(void *prealloc,uint flags)

{
  secp256k1_fe *psVar1;
  secp256k1_fe *b;
  long lVar2;
  secp256k1_fe_storage *r;
  bool bVar3;
  secp256k1_fe zi;
  secp256k1_gej pj;
  secp256k1_ge last_ge;
  secp256k1_gej d;
  secp256k1_fe dx_over_dz_squared;
  secp256k1_fe zr;
  secp256k1_fe zi2;
  secp256k1_ge d_ge;
  secp256k1_ge a_ge;
  secp256k1_ge local_3f8;
  secp256k1_fe local_3a0;
  secp256k1_gej local_378;
  secp256k1_ge local_2f0;
  secp256k1_gej local_298;
  secp256k1_fe local_218;
  secp256k1_fe local_1e8;
  secp256k1_fe local_1b8;
  secp256k1_fe local_190;
  secp256k1_ge local_168;
  secp256k1_ge local_110;
  secp256k1_gej local_b8;
  
  secp256k1_context_preallocated_size(flags);
  *(secp256k1_callback *)((long)prealloc + 0xc0) = default_error_callback;
  if ((char)flags == '\x01') {
    *(undefined1 (*) [16])prealloc = (undefined1  [16])0x0;
    if ((flags >> 9 & 1) != 0) {
      *(secp256k1_ge_storage (**) [16])((long)prealloc + 8) = secp256k1_ecmult_static_context;
      secp256k1_ecmult_gen_blind((secp256k1_ecmult_gen_context *)((long)prealloc + 8),(uchar *)0x0);
    }
    if (((flags >> 8 & 1) != 0) && (*prealloc == 0)) {
      local_b8.infinity = 0;
      local_b8.x.n[0] = 0x2815b16f81798;
      local_b8.x.n[1] = 0xdb2dce28d959f;
      local_b8.x.n[2] = 0xe870b07029bfc;
      local_b8.x.n[3] = 0xbbac55a06295c;
      local_b8.x.n[4] = 0x79be667ef9dc;
      local_b8.y.n[0] = 0x7d08ffb10d4b8;
      local_b8.y.n[1] = 0x48a68554199c4;
      local_b8.y.n[2] = 0xe1108a8fd17b4;
      local_b8.y.n[3] = 0xc4655da4fbfc0;
      local_b8.y.n[4] = 0x483ada7726a3;
      local_b8.z.n[0] = 1;
      local_b8.z.n[1] = 0;
      local_b8.z.n[2] = 0;
      local_b8.z.n[3] = 0;
      local_b8.z.n[4] = 0;
      *(secp256k1_fe_storage **)prealloc = (secp256k1_fe_storage *)((long)prealloc + 0xd0);
      secp256k1_gej_double_var(&local_298,&local_b8,(secp256k1_fe *)0x0);
      local_168.x.n[4] = local_298.x.n[4];
      local_168.x.n[2] = local_298.x.n[2];
      local_168.x.n[3] = local_298.x.n[3];
      local_168.x.n[0] = local_298.x.n[0];
      local_168.x.n[1] = local_298.x.n[1];
      local_168.y.n[0] = local_298.y.n[0];
      local_168.y.n[1] = local_298.y.n[1];
      local_168.y.n[2] = local_298.y.n[2];
      local_168.y.n[3] = local_298.y.n[3];
      local_168.y.n[4] = local_298.y.n[4];
      local_168.infinity = 0;
      secp256k1_ge_set_gej_zinv(&local_110,&local_b8,&local_298.z);
      psVar1 = &local_378.y;
      local_378.x.n[4] = local_110.x.n[4];
      local_378.x.n[2] = local_110.x.n[2];
      local_378.x.n[3] = local_110.x.n[3];
      local_378.x.n[0] = local_110.x.n[0];
      local_378.x.n[1] = local_110.x.n[1];
      local_378.y.n[0] = local_110.y.n[0];
      local_378.y.n[1] = local_110.y.n[1];
      local_378.y.n[2] = local_110.y.n[2];
      local_378.y.n[3] = local_110.y.n[3];
      local_378.y.n[4] = local_110.y.n[4];
      local_378.z.n[0] = local_b8.z.n[0];
      local_378.z.n[1] = local_b8.z.n[1];
      local_378.z.n[2] = local_b8.z.n[2];
      local_378.z.n[3] = local_b8.z.n[3];
      local_378.z.n[4] = local_b8.z.n[4];
      local_378.infinity = 0;
      local_1e8.n[4] = local_298.z.n[4];
      local_1e8.n[2] = local_298.z.n[2];
      local_1e8.n[3] = local_298.z.n[3];
      local_1e8.n[0] = local_298.z.n[0];
      local_1e8.n[1] = local_298.z.n[1];
      secp256k1_fe_normalize_var(&local_1e8);
      secp256k1_fe_to_storage((secp256k1_fe_storage *)((long)prealloc + 0xd0),&local_1e8);
      secp256k1_fe_normalize_var(psVar1);
      secp256k1_fe_to_storage((secp256k1_fe_storage *)((long)prealloc + 0xf0),psVar1);
      r = (secp256k1_fe_storage *)((long)prealloc + 0x130);
      lVar2 = 0x3fff;
      while (bVar3 = lVar2 != 0, lVar2 = lVar2 + -1, bVar3) {
        secp256k1_gej_add_ge_var(&local_378,&local_378,&local_168,&local_1e8);
        secp256k1_fe_normalize_var(&local_1e8);
        secp256k1_fe_to_storage(r + -1,&local_1e8);
        secp256k1_fe_normalize_var(psVar1);
        secp256k1_fe_to_storage(r,psVar1);
        r = r + 2;
      }
      psVar1 = &local_378.z;
      b = &local_298.z;
      secp256k1_fe_mul(psVar1,psVar1,b);
      secp256k1_fe_inv(&local_3a0,psVar1);
      secp256k1_ge_set_gej_zinv(&local_3f8,&local_378,&local_3a0);
      secp256k1_ge_from_storage(&local_2f0,(secp256k1_ge_storage *)((long)prealloc + 0x100090));
      secp256k1_ge_to_storage((secp256k1_ge_storage *)((long)prealloc + 0x100090),&local_3f8);
      secp256k1_fe_inv(b,b);
      secp256k1_fe_sqr(&local_218,b);
      secp256k1_fe_mul(&local_218,&local_218,&local_298.x);
      for (lVar2 = 0x100050; lVar2 != 0x90; lVar2 = lVar2 + -0x40) {
        secp256k1_fe_mul(&local_3a0,&local_3a0,&local_2f0.x);
        secp256k1_fe_sqr(&local_190,&local_3a0);
        secp256k1_fe_mul(&local_1b8,&local_190,&local_3a0);
        secp256k1_fe_mul(&local_3f8.x,&local_2f0.x,&local_190);
        local_3f8.x.n[0] = (local_218.n[0] + 0x3ffffbfffff0bc) - local_3f8.x.n[0];
        local_3f8.x.n[1] = (local_218.n[1] + 0x3ffffffffffffc) - local_3f8.x.n[1];
        local_3f8.x.n[2] = (local_218.n[2] + 0x3ffffffffffffc) - local_3f8.x.n[2];
        local_3f8.x.n[3] = (local_218.n[3] + 0x3ffffffffffffc) - local_3f8.x.n[3];
        local_3f8.x.n[4] = (local_218.n[4] + 0x3fffffffffffc) - local_3f8.x.n[4];
        secp256k1_ge_from_storage(&local_2f0,(secp256k1_ge_storage *)((long)prealloc + lVar2));
        secp256k1_fe_mul(&local_3f8.y,&local_2f0.y,&local_1b8);
        secp256k1_ge_to_storage((secp256k1_ge_storage *)((long)prealloc + lVar2),&local_3f8);
      }
    }
  }
  else {
    (**(code **)((long)prealloc + 0xb0))("Invalid flags",*(undefined8 *)((long)prealloc + 0xb8));
    prealloc = (secp256k1_context *)0x0;
  }
  return (secp256k1_context *)prealloc;
}

Assistant:

secp256k1_context* secp256k1_context_preallocated_create(void* prealloc, unsigned int flags) {
    void* const base = prealloc;
    size_t prealloc_size;
    secp256k1_context* ret;

    VERIFY_CHECK(prealloc != NULL);
    prealloc_size = secp256k1_context_preallocated_size(flags);
    ret = (secp256k1_context*)manual_alloc(&prealloc, sizeof(secp256k1_context), base, prealloc_size);
    ret->error_callback = default_error_callback;

    if (EXPECT((flags & SECP256K1_FLAGS_TYPE_MASK) != SECP256K1_FLAGS_TYPE_CONTEXT, 0)) {
            secp256k1_callback_call(&ret->illegal_callback,
                                    "Invalid flags");
            return NULL;
    }

    secp256k1_ecmult_context_init(&ret->ecmult_ctx);
    secp256k1_ecmult_gen_context_init(&ret->ecmult_gen_ctx);

    if (flags & SECP256K1_FLAGS_BIT_CONTEXT_SIGN) {
        secp256k1_ecmult_gen_context_build(&ret->ecmult_gen_ctx, &prealloc);
    }
    if (flags & SECP256K1_FLAGS_BIT_CONTEXT_VERIFY) {
        secp256k1_ecmult_context_build(&ret->ecmult_ctx, &prealloc);
    }

    return (secp256k1_context*)ret;
}